

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffc2s(char *instr,char *outstr,int *status)

{
  int *piVar1;
  size_t sVar2;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  char *in_RSI;
  char *in_RDI;
  size_t ii;
  size_t len;
  int jj;
  ulong local_38;
  int local_24;
  int local_4;
  
  piVar1 = (int *)CONCAT71(in_register_00000011,in_DL);
  if (*piVar1 < 1) {
    if (*in_RDI == '\'') {
      sVar2 = strlen(in_RDI);
      local_24 = 0;
      for (local_38 = 1; local_38 < sVar2; local_38 = local_38 + 1) {
        if (in_RDI[local_38] == '\'') {
          if (in_RDI[local_38 + 1] != '\'') break;
          local_38 = local_38 + 1;
        }
        in_RSI[local_24] = in_RDI[local_38];
        local_24 = local_24 + 1;
      }
      in_RSI[local_24] = '\0';
      if (local_38 == sVar2) {
        ffpmsg((char *)0x18351e);
        ffpmsg((char *)0x183528);
        *piVar1 = 0xcd;
        local_4 = 0xcd;
      }
      else {
        while ((local_24 = local_24 + -1, -1 < local_24 && (in_RSI[local_24] == ' '))) {
          in_RSI[local_24] = '\0';
        }
        local_4 = *piVar1;
      }
    }
    else if (*in_RDI == '\0') {
      *in_RSI = '\0';
      *piVar1 = 0xcc;
      local_4 = 0xcc;
    }
    else {
      strcpy(in_RSI,in_RDI);
      local_4 = *piVar1;
    }
  }
  else {
    local_4 = *piVar1;
  }
  return local_4;
}

Assistant:

int ffc2s(const char *instr,  /* I - null terminated quoted input string */
          char *outstr,       /* O - null terminated output string without quotes */
          int *status)        /* IO - error status */
/*
    convert an input quoted string to an unquoted string by removing
    the leading and trailing quote character.  Also, replace any
    pairs of single quote characters with just a single quote 
    character (FITS used a pair of single quotes to represent
    a literal quote character within the string).
*/
{
    int jj;
    size_t len, ii;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (instr[0] != '\'')
    {
        if (instr[0] == '\0') {
           outstr[0] = '\0';
           return(*status = VALUE_UNDEFINED);  /* null value string */
        } else {
          strcpy(outstr, instr);  /* no leading quote, so return input string */
          return(*status);
        }
    }

    len = strlen(instr);

    for (ii=1, jj=0; ii < len; ii++, jj++)
    {
        if (instr[ii] == '\'')  /*  is this the closing quote?  */
        {
            if (instr[ii+1] == '\'')  /* 2 successive quotes? */
                ii++;  /* copy only one of the quotes */
            else
                break;   /*  found the closing quote, so exit this loop  */
        }
        outstr[jj] = instr[ii];   /* copy the next character to the output */
    }

    outstr[jj] = '\0';             /*  terminate the output string  */

    if (ii == len)
    {
        ffpmsg("This string value has no closing quote (ffc2s):");
        ffpmsg(instr);
        return(*status = 205);
    }

    for (jj--; jj >= 0; jj--)  /* replace trailing blanks with nulls */
    {
        if (outstr[jj] == ' ')
            outstr[jj] = 0;
        else
            break;
    }

    return(*status);
}